

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O3

void __thiscall
JtagAnalyzer::CloseFrameV2
          (JtagAnalyzer *this,Frame *frm,JtagShiftedData *shifted_data,U64 ending_sample_number)

{
  char *pcVar1;
  FrameV2 frame_v2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  JtagShiftedData corrected_shifted_data;
  FrameV2 aFStack_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  JtagShiftedData local_58;
  
  local_58.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CloseFrame(this,frm,shifted_data,ending_sample_number,&local_58);
  FrameV2::FrameV2(aFStack_78);
  if (local_58.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    BitsToBytes(&local_70,&local_58.mTdiBits);
    FrameV2::AddByteArray
              ((char *)aFStack_78,(uchar *)"TDI",
               (ulonglong)
               local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_58.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    BitsToBytes(&local_70,&local_58.mTdoBits);
    FrameV2::AddByteArray
              ((char *)aFStack_78,"TDO",
               (ulonglong)
               local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  FrameV2::AddInteger((char *)aFStack_78,0x10d179);
  pcVar1 = JtagAnalyzerResults::GetStateDescShort((this->mTAPCtrl).mCurrTAPState);
  AnalyzerResults::AddFrameV2
            ((FrameV2 *)(this->mResults)._M_ptr,(char *)aFStack_78,(ulonglong)pcVar1,
             *(ulonglong *)frm);
  FrameV2::~FrameV2(aFStack_78);
  if (local_58.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.mTdoBits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.mTdiBits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void JtagAnalyzer::CloseFrameV2( Frame& frm, JtagShiftedData& shifted_data, U64 ending_sample_number )
{
    JtagShiftedData corrected_shifted_data;

    CloseFrame( frm, shifted_data, ending_sample_number, &corrected_shifted_data );

    FrameV2 frame_v2;

    size_t max_bit_count = 0;

    if( corrected_shifted_data.mTdiBits.size() > 0 )
    {
        std::vector<U8> data = BitsToBytes( corrected_shifted_data.mTdiBits );

        frame_v2.AddByteArray( "TDI", &data[ 0 ], data.size() );

        if( max_bit_count < corrected_shifted_data.mTdiBits.size() )
        {
            max_bit_count = corrected_shifted_data.mTdiBits.size();
        }
    }

    if( corrected_shifted_data.mTdoBits.size() > 0 )
    {
        std::vector<U8> data = BitsToBytes( corrected_shifted_data.mTdoBits );

        frame_v2.AddByteArray( "TDO", &data[ 0 ], data.size() );

        if( max_bit_count < corrected_shifted_data.mTdoBits.size() )
        {
            max_bit_count = corrected_shifted_data.mTdoBits.size();
        }
    }

    frame_v2.AddInteger( "BitCount", max_bit_count );

    const char* type = JtagAnalyzerResults::GetStateDescShort( mTAPCtrl.GetCurrState() );

    mResults->AddFrameV2( frame_v2, type, frm.mStartingSampleInclusive, frm.mEndingSampleInclusive );
}